

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O0

TPZMatrix<double> * __thiscall
TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_>::Create
          (TPZSpStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  TPZStack<long,_10> *in_RDI;
  TPZMatrix<double> *mat;
  TPZVec<long> elgraphindex;
  TPZStack<long,_10> elgraph;
  int64_t neq;
  size_t in_stack_00000348;
  char *in_stack_00000350;
  TPZCompMesh *in_stack_ffffffffffffff60;
  undefined1 local_80 [64];
  TPZVec<long> *in_stack_ffffffffffffffc0;
  TPZStack<long,_10> *in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  TPZVec<long> *this_00;
  
  TPZCompMesh::NEquations(in_stack_ffffffffffffff60);
  lVar2 = (**(code **)(*(in_RDI->super_TPZManVector<long,_10>).super_TPZVec<long>.fStore + 0x98))();
  if (lVar2 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n"
                   );
    pzinternal::DebugStopImpl(in_stack_00000350,in_stack_00000348);
  }
  TPZStack<long,_10>::TPZStack(in_RDI);
  TPZVec<long>::TPZVec((TPZVec<long> *)&stack0xffffffffffffff60);
  TPZCompMesh::ComputeElGraph
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar1 = (*(in_RDI->super_TPZManVector<long,_10>).super_TPZVec<long>._vptr_TPZVec[0xc])
                    (in_RDI,local_80,&stack0xffffffffffffff60);
  this_00 = (TPZVec<long> *)CONCAT44(extraout_var,iVar1);
  TPZVec<long>::~TPZVec(this_00);
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1da13a3);
  return (TPZMatrix<double> *)this_00;
}

Assistant:

TPZMatrix<TVar> * TPZSpStructMatrix<TVar,TPar>::Create(){
    int64_t neq = this->fMesh->NEquations();
    if(this->fMesh->FatherMesh()) {
		PZError << "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n";
		DebugStop();
    }
	
    /**
     *Longhin implementation
	 */
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
    //    int nnodes = 0;
    this->fMesh->ComputeElGraph(elgraph,elgraphindex);
    TPZMatrix<TVar> * mat = SetupMatrixData(elgraph,elgraphindex);
    return mat;
}